

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_long> * __thiscall
cimg_library::CImg<unsigned_long>::fill(CImg<unsigned_long> *this,unsigned_long val)

{
  unsigned_long *puVar1;
  bool bVar2;
  unsigned_long uVar3;
  unsigned_long *_maxptrd;
  unsigned_long *ptrd;
  unsigned_long val_local;
  CImg<unsigned_long> *this_local;
  
  bVar2 = is_empty(this);
  if (!bVar2) {
    if (val == 0) {
      puVar1 = this->_data;
      uVar3 = size(this);
      memset(puVar1,0,uVar3 << 3);
    }
    else {
      _maxptrd = this->_data;
      puVar1 = this->_data;
      uVar3 = size(this);
      for (; _maxptrd < puVar1 + uVar3; _maxptrd = _maxptrd + 1) {
        *_maxptrd = val;
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)val,sizeof(T)*size());
      return *this;
    }